

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

date_t duckdb::TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::
       Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                 (interval_t bucket_width,date_t ts,interval_t offset)

{
  bool bVar1;
  date_t dVar2;
  int32_t ts_months;
  Interval *pIVar3;
  int64_t extraout_RDX;
  int64_t iVar4;
  interval_t iVar5;
  interval_t right;
  interval_t interval;
  
  iVar4 = offset.micros;
  pIVar3 = offset._0_8_;
  bVar1 = Value::IsFinite<duckdb::date_t>(ts);
  if (bVar1) {
    interval.micros = extraout_RDX;
    interval.months = (int)iVar4;
    interval.days = (int)((ulong)iVar4 >> 0x20);
    iVar5 = Interval::Invert(offset._0_8_,interval);
    right._0_8_ = iVar5.micros;
    right.micros = (int64_t)pIVar3;
    dVar2 = Interval::Add((Interval *)(ulong)(uint)ts.days,iVar5.months,right);
    ts_months = EpochMonths<duckdb::date_t>(dVar2);
    dVar2 = WidthConvertibleToMonthsCommon(bucket_width.months,ts_months,0x168);
    dVar2 = Cast::Operation<duckdb::date_t,duckdb::date_t>(dVar2);
    iVar5.micros = (int64_t)pIVar3;
    iVar5.months = (int)iVar4;
    iVar5.days = (int)((ulong)iVar4 >> 0x20);
    dVar2 = Interval::Add((Interval *)(ulong)(uint)dVar2.days,offset.months,iVar5);
    return (date_t)dVar2.days;
  }
  dVar2 = Cast::Operation<duckdb::date_t,duckdb::date_t>(ts);
  return (date_t)dVar2.days;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(Interval::Add(ts, Interval::Invert(offset)));
			return Interval::Add(Cast::template Operation<date_t, TR>(WidthConvertibleToMonthsCommon(
			                         bucket_width.months, ts_months, DEFAULT_ORIGIN_MONTHS)),
			                     offset);
		}